

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

void __thiscall OutputStream::writeVaruint(OutputStream *this,uint64_t v)

{
  bool bVar1;
  uint64_t uVar2;
  
  uVar2 = v;
  if (0x7f < v) {
    do {
      (**this->_vptr_OutputStream)(this,(ulong)(byte)((byte)v | 0x80));
      uVar2 = v >> 7;
      bVar1 = 0x3fff < v;
      v = uVar2;
    } while (bVar1);
  }
  (**this->_vptr_OutputStream)(this,uVar2 & 0xff);
  return;
}

Assistant:

void OutputStream::writeVaruint(uint64_t v) {

  while (v > 0x7F) {
    writeByte(0x80 | uint8_t(v & 0x7F));
    v >>= 7;
  }

  writeByte(uint8_t(v));
}